

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  byte *cur;
  CLzRef *pCVar2;
  UInt32 maxLen;
  UInt32 UVar3;
  byte *pbVar4;
  UInt32 *pUVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ptrdiff_t diff;
  long lVar11;
  UInt32 UVar12;
  byte *pbVar5;
  
  lenLimit = p->lenLimit;
  uVar8 = (ulong)lenLimit;
  if (uVar8 < 3) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar9 = (uint)cur[1] ^ p->crc[*cur];
  uVar10 = uVar9 & 0x3ff;
  pCVar2 = p->hash;
  CVar1 = p->pos;
  uVar7 = CVar1 - pCVar2[uVar10];
  uVar9 = (((uint)cur[2] << 8 ^ uVar9) & p->hashMask) + 0x400;
  UVar3 = pCVar2[uVar9];
  pCVar2[uVar10] = CVar1;
  pCVar2[uVar9] = CVar1;
  UVar12 = p->cyclicBufferSize;
  maxLen = 2;
  if ((uVar7 < UVar12) && (cur[-(ulong)uVar7] == *cur)) {
    pbVar4 = cur + 2;
    lVar11 = uVar8 - 2;
    do {
      pbVar5 = pbVar4;
      if (pbVar4[-(ulong)uVar7] != *pbVar4) break;
      pbVar4 = pbVar4 + 1;
      lVar11 = lVar11 + -1;
      pbVar5 = cur + uVar8;
    } while (lVar11 != 0);
    maxLen = (int)pbVar5 - (int)cur;
    *distances = maxLen;
    distances[1] = uVar7 - 1;
    UVar12 = p->cyclicBufferSize;
    lVar11 = 2;
    if (lenLimit == maxLen) {
      SkipMatchesSpec(lenLimit,UVar3,p->pos,cur,p->son,p->cyclicBufferPos,UVar12,p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar3 = p->pos + 1;
      p->pos = UVar3;
      UVar12 = 2;
      goto LAB_00115143;
    }
  }
  else {
    lVar11 = 0;
  }
  pUVar6 = GetMatchesSpec1(lenLimit,UVar3,p->pos,cur,p->son,p->cyclicBufferPos,UVar12,p->cutValue,
                           distances + lVar11,maxLen);
  UVar12 = (UInt32)((ulong)((long)pUVar6 - (long)distances) >> 2);
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar3 = p->pos + 1;
  p->pos = UVar3;
LAB_00115143:
  if (UVar3 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar12;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, d2, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[h2];

  curMatch = hash[kFix3HashSize + hv];
  
  hash[h2] = pos;
  hash[kFix3HashSize + hv] = pos;

  maxLen = 2;
  offset = 0;

  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    UPDATE_maxLen
    distances[0] = maxLen;
    distances[1] = d2 - 1;
    offset = 2;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  GET_MATCHES_FOOTER(offset, maxLen)
}